

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::FillProjectMap(cmGlobalGenerator *this)

{
  bool bVar1;
  reference this_00;
  pointer this_01;
  mapped_type *this_02;
  cmStateSnapshot local_b8;
  pointer local_a0 [3];
  undefined1 local_88 [8];
  string snpProjName;
  string name;
  cmStateSnapshot snp;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  iterator __end1;
  iterator __begin1;
  LocalGeneratorVector *__range1;
  cmGlobalGenerator *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  ::clear(&this->ProjectMap);
  __end1 = std::
           vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ::begin(&this->LocalGenerators);
  localGen = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
             std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::end(&this->LocalGenerators);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                     *)&localGen), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
              ::operator*(&__end1);
    this_01 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                        (this_00);
    cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)((long)&name.field_2 + 8),this_01);
    std::__cxx11::string::string((string *)(snpProjName.field_2._M_local_buf + 8));
    do {
      cmStateSnapshot::GetProjectName_abi_cxx11_
                ((string *)local_88,(cmStateSnapshot *)((long)&name.field_2 + 8));
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&snpProjName.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_88);
      if (bVar1) {
        std::__cxx11::string::operator=
                  ((string *)(snpProjName.field_2._M_local_buf + 8),(string *)local_88);
        this_02 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
                  ::operator[](&this->ProjectMap,(key_type *)((long)&snpProjName.field_2 + 8));
        local_a0[0] = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::get
                                (this_00);
        std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::push_back
                  (this_02,local_a0);
      }
      cmStateSnapshot::GetBuildsystemDirectoryParent
                (&local_b8,(cmStateSnapshot *)((long)&name.field_2 + 8));
      name.field_2._8_8_ = local_b8.State;
      std::__cxx11::string::~string((string *)local_88);
      bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)((long)&name.field_2 + 8));
    } while (bVar1);
    std::__cxx11::string::~string((string *)(snpProjName.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::FillProjectMap()
{
  this->ProjectMap.clear(); // make sure we start with a clean map
  for (const auto& localGen : this->LocalGenerators) {
    // for each local generator add all projects
    cmStateSnapshot snp = localGen->GetStateSnapshot();
    std::string name;
    do {
      std::string snpProjName = snp.GetProjectName();
      if (name != snpProjName) {
        name = snpProjName;
        this->ProjectMap[name].push_back(localGen.get());
      }
      snp = snp.GetBuildsystemDirectoryParent();
    } while (snp.IsValid());
  }
}